

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregate_State_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Aggregate_State_PDU::SetVariableDatumList
          (Aggregate_State_PDU *this,
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
          *VD)

{
  uint uVar1;
  pointer pKVar2;
  pointer pKVar3;
  
  ClearVariableDatumList(this);
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
  ::operator=(&this->m_vVD,VD);
  pKVar2 = (this->m_vVD).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar3 = pKVar2;
  if (pKVar2 != (this->m_vVD).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      uVar1 = (*(pKVar3->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[8])();
      (this->super_Header).super_Header6.m_ui16PDULength =
           (short)(uVar1 >> 3) + (this->super_Header).super_Header6.m_ui16PDULength + 8;
      pKVar3 = pKVar3 + 1;
    } while (pKVar3 != (this->m_vVD).
                       super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    pKVar2 = (this->m_vVD).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  this->m_ui32NumVariableDatum = (int)((ulong)((long)pKVar3 - (long)pKVar2) >> 3) * -0x55555555;
  return;
}

Assistant:

void Aggregate_State_PDU::SetVariableDatumList( const vector<VarDtmPtr> & VD )
{
    ClearVariableDatumList();

    m_vVD = VD;

    vector<VarDtmPtr>::const_iterator citr = m_vVD.begin();
    vector<VarDtmPtr>::const_iterator citrEnd = m_vVD.end();
    for( citr = m_vVD.begin(); citr != m_vVD.end(); ++citr )
    {
        m_ui16PDULength += VariableDatum::VARIABLE_DATUM_SIZE + ( ( *citr )->GetDatumLength() / 8 );
    }

    m_ui32NumVariableDatum = m_vVD.size();
}